

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O0

uint64_t __thiscall
poplar::
map<poplar::compact_bonsai_trie<85U,_5U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>
::alloc_bytes(map<poplar::compact_bonsai_trie<85U,_5U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>
              *this)

{
  uint64_t uVar1;
  compact_bonsai_nlm<int,_16UL> *this_00;
  size_type sVar2;
  long in_RDI;
  uint64_t bytes;
  long lVar3;
  
  lVar3 = 0;
  uVar1 = compact_bonsai_trie<85U,_5U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
          ::alloc_bytes((compact_bonsai_trie<85U,_5U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
                         *)0x0);
  this_00 = (compact_bonsai_nlm<int,_16UL> *)(uVar1 + lVar3);
  uVar1 = compact_bonsai_nlm<int,_16UL>::alloc_bytes(this_00);
  lVar3 = (long)&(this_00->ptrs_).
                 super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar1;
  sVar2 = std::array<unsigned_char,_256UL>::size((array<unsigned_char,_256UL> *)(in_RDI + 0x198));
  return sVar2 + lVar3;
}

Assistant:

uint64_t alloc_bytes() const {
        uint64_t bytes = 0;
        bytes += hash_trie_.alloc_bytes();
        bytes += label_store_.alloc_bytes();
        bytes += codes_.size();
        return bytes;
    }